

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall
Annotator_getVariablePairFromId_Test::TestBody(Annotator_getVariablePairFromId_Test *this)

{
  string *psVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char cVar6;
  undefined4 uVar7;
  char *pcVar8;
  AssertionResult gtest_ar_10;
  VariablePairPtr vpc;
  AssertionResult gtest_ar_;
  VariablePairPtr vpm;
  ResetPtr reset;
  AnnotatorPtr annotator;
  ComponentPtr c1;
  ComponentPtr c2;
  ModelPtr model;
  UnitsPtr units;
  VariablePtr v4;
  VariablePtr v3;
  VariablePtr v2;
  VariablePtr v1;
  AssertionResult local_188;
  long local_178 [2];
  shared_ptr<libcellml::Units> local_168;
  CellmlElementType local_158 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  shared_ptr<libcellml::Component> local_148;
  string *local_138;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  long local_128 [2];
  shared_ptr<libcellml::Reset> local_118;
  long local_108 [2];
  unsigned_long local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  shared_ptr *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  long local_d8 [2];
  CellmlElementType local_c4;
  shared_ptr<libcellml::Component> local_c0;
  shared_ptr *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  shared_ptr<libcellml::Model> local_a0;
  shared_ptr<libcellml::Units> local_90;
  long local_80 [2];
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr<libcellml::Variable> local_50;
  shared_ptr<libcellml::Variable> local_40;
  
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"model","");
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"c1","");
  local_138 = (string *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"c2","");
  local_e8 = (shared_ptr *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"v1","");
  local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v2","");
  createModelTwoComponentsWithOneVariableEach
            ((string *)&local_a0,(string *)&local_188,(string *)&local_118,(string *)&local_138,
             (string *)&local_e8);
  if (local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_80) {
    operator_delete(local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    ,local_80[0] + 1);
  }
  if (local_e8 != (shared_ptr *)local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  if (local_138 != (string *)local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  libcellml::Annotator::create();
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"units","");
  libcellml::Units::create((string *)&local_90);
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  peVar5 = local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"metre","");
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"unit1_id","");
  libcellml::Units::addUnit((string *)peVar5,1.0,(string *)&local_188);
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  peVar5 = local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"second","");
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"unit2_id","");
  libcellml::Units::addUnit((string *)peVar5,1.0,(string *)&local_188);
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  peVar5 = local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"newton","");
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"unit3_id","");
  libcellml::Units::addUnit((string *)peVar5,1.0,(string *)&local_188);
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  libcellml::Model::addUnits
            ((shared_ptr *)
             local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  peVar4 = local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"c1","");
  libcellml::ComponentEntity::component((string *)&local_c0,SUB81(peVar4,0));
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  peVar4 = local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"c2","");
  libcellml::ComponentEntity::component((string *)&local_b0,SUB81(peVar4,0));
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v1","");
  libcellml::Component::variable((string *)&local_40);
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v2","");
  libcellml::Component::variable((string *)&local_50);
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v3","");
  libcellml::Variable::create((string *)&local_60);
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v4","");
  libcellml::Variable::create((string *)&local_70);
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  libcellml::Component::addVariable
            ((shared_ptr *)
             local_c0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable(local_b0);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             local_c0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"encapsulation_id","");
  libcellml::ComponentEntity::setEncapsulationId
            ((string *)
             local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  peVar3 = local_c0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"component_ref1_id","");
  libcellml::ComponentEntity::setEncapsulationId((string *)peVar3);
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"component_ref2_id","");
  libcellml::ComponentEntity::setEncapsulationId((string *)local_b0);
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v1","");
  libcellml::Component::variable((string *)&local_138);
  psVar1 = local_138;
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"public_and_private","");
  libcellml::Variable::setInterfaceType(psVar1);
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if (local_130.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v2","");
  libcellml::Component::variable((string *)&local_138);
  psVar1 = local_138;
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"public_and_private","");
  libcellml::Variable::setInterfaceType(psVar1);
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if (local_130.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v3","");
  libcellml::Component::variable((string *)&local_138);
  psVar1 = local_138;
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"public_and_private","");
  libcellml::Variable::setInterfaceType(psVar1);
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if (local_130.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v4","");
  libcellml::Component::variable((string *)&local_138);
  psVar1 = local_138;
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"public_and_private","");
  libcellml::Variable::setInterfaceType(psVar1);
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if (local_130.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v1","");
  libcellml::Component::variable((string *)&local_138);
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v2","");
  libcellml::Component::variable((string *)&local_168);
  libcellml::Variable::addEquivalence((shared_ptr *)&local_138,(shared_ptr *)&local_168);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if (local_130.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v3","");
  libcellml::Component::variable((string *)&local_138);
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v4","");
  libcellml::Component::variable((string *)&local_168);
  libcellml::Variable::addEquivalence((shared_ptr *)&local_138,(shared_ptr *)&local_168);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if (local_130.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v1","");
  libcellml::Component::variable((string *)&local_168);
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v2","");
  libcellml::Component::variable((string *)local_158);
  local_138 = (string *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"map_id","");
  libcellml::Variable::setEquivalenceMappingId
            ((shared_ptr *)&local_168,(shared_ptr *)local_158,(string *)&local_138);
  if (local_138 != (string *)local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"v1","");
  libcellml::Component::variable((string *)&local_168);
  local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v2","");
  libcellml::Component::variable((string *)local_158);
  local_138 = (string *)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"connection_id","");
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)&local_168,(shared_ptr *)local_158,(string *)&local_138);
  if (local_138 != (string *)local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_108) {
    operator_delete(local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_108[0] + 1);
  }
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  libcellml::Reset::create();
  peVar2 = local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"reset_value_id","");
  libcellml::Reset::setResetValueId((string *)peVar2);
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  peVar2 = local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"test_value_id","");
  libcellml::Reset::setTestValueId((string *)peVar2);
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  libcellml::Component::addReset
            ((shared_ptr *)
             local_c0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Annotator::setModel(local_e8);
  local_158[0] = UNIT;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"unit1_id","");
  libcellml::Annotator::item((string *)&local_168);
  uVar7 = libcellml::AnyCellmlElement::type();
  local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,uVar7);
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_138,"libcellml::CellmlElementType::UNIT",
             "annotator->item(\"unit1_id\")->type()",local_158,(CellmlElementType *)&local_148);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8c,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"unit1_id","");
  libcellml::Annotator::item((string *)&local_148);
  libcellml::AnyCellmlElement::unitsItem();
  libcellml::UnitsItem::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((internal *)&local_138,"units","annotator->item(\"unit1_id\")->unitsItem()->units()",
             &local_90,&local_168);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8d,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"unit1_id","");
  libcellml::Annotator::item((string *)local_158);
  libcellml::AnyCellmlElement::unitsItem();
  local_f8 = libcellml::UnitsItem::index();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_138,"size_t(0)",
             "annotator->item(\"unit1_id\")->unitsItem()->index()",(unsigned_long *)&local_148,
             &local_f8);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8e,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_158[0] = UNIT;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"unit2_id","");
  libcellml::Annotator::item((string *)&local_168);
  uVar7 = libcellml::AnyCellmlElement::type();
  local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,uVar7);
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_138,"libcellml::CellmlElementType::UNIT",
             "annotator->item(\"unit2_id\")->type()",local_158,(CellmlElementType *)&local_148);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x8f,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"unit2_id","");
  libcellml::Annotator::item((string *)&local_148);
  libcellml::AnyCellmlElement::unitsItem();
  libcellml::UnitsItem::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((internal *)&local_138,"units","annotator->item(\"unit2_id\")->unitsItem()->units()",
             &local_90,&local_168);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x90,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"unit2_id","");
  libcellml::Annotator::item((string *)local_158);
  libcellml::AnyCellmlElement::unitsItem();
  local_f8 = libcellml::UnitsItem::index();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_138,"size_t(1)",
             "annotator->item(\"unit2_id\")->unitsItem()->index()",(unsigned_long *)&local_148,
             &local_f8);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x91,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_158[0] = UNIT;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"unit3_id","");
  libcellml::Annotator::item((string *)&local_168);
  uVar7 = libcellml::AnyCellmlElement::type();
  local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,uVar7);
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_138,"libcellml::CellmlElementType::UNIT",
             "annotator->item(\"unit3_id\")->type()",local_158,(CellmlElementType *)&local_148);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x92,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"unit3_id","");
  libcellml::Annotator::item((string *)&local_148);
  libcellml::AnyCellmlElement::unitsItem();
  libcellml::UnitsItem::units();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((internal *)&local_138,"units","annotator->item(\"unit3_id\")->unitsItem()->units()",
             &local_90,&local_168);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x93,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x2;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"unit3_id","");
  libcellml::Annotator::item((string *)local_158);
  libcellml::AnyCellmlElement::unitsItem();
  local_f8 = libcellml::UnitsItem::index();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_138,"size_t(2)",
             "annotator->item(\"unit3_id\")->unitsItem()->index()",(unsigned_long *)&local_148,
             &local_f8);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x94,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_158[0] = MAP_VARIABLES;
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"map_id","");
  libcellml::Annotator::item((string *)&local_168);
  uVar7 = libcellml::AnyCellmlElement::type();
  local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,uVar7);
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_138,"libcellml::CellmlElementType::MAP_VARIABLES",
             "annotator->item(\"map_id\")->type()",local_158,(CellmlElementType *)&local_148);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_138._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x98,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"map_id","");
  libcellml::Annotator::item((string *)&local_168);
  libcellml::AnyCellmlElement::variablePair();
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  libcellml::VariablePair::variable1();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((internal *)&local_188,"v1","vpm->variable1()",&local_40,
             (shared_ptr<libcellml::Variable> *)&local_168);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string)local_188.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (local_188.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_188.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x9a,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (((CONCAT71(local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._1_7_,local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr._0_1_) != 0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((long *)CONCAT71(local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._1_7_,
                         local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_168.
                                     super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     local_168.
                                     super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_188.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  libcellml::VariablePair::variable2();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((internal *)&local_188,"v2","vpm->variable2()",&local_50,
             (shared_ptr<libcellml::Variable> *)&local_168);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((string)local_188.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_168);
    if (local_188.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_188.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x9b,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (((CONCAT71(local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._1_7_,local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr._0_1_) != 0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((long *)CONCAT71(local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._1_7_,
                         local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_168.
                                     super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._1_7_,
                                     local_168.
                                     super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr._0_1_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_188.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,2);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"connection_id","");
  libcellml::Annotator::item((string *)local_158);
  uVar7 = libcellml::AnyCellmlElement::type();
  local_f8 = CONCAT44(local_f8._4_4_,uVar7);
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)&local_168,"libcellml::CellmlElementType::CONNECTION",
             "annotator->item(\"connection_id\")->type()",(CellmlElementType *)&local_148,
             (CellmlElementType *)&local_f8);
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ ==
      (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x9c,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"connection_id","");
  libcellml::Annotator::item((string *)local_158);
  libcellml::AnyCellmlElement::variablePair();
  if (local_150.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150.ptr_);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  libcellml::VariablePair::variable1();
  if (local_40.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)local_188._0_8_) {
    local_158[0] = CONCAT31(local_158[0]._1_3_,1);
    local_150.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    libcellml::VariablePair::variable1();
    local_158[0] = CONCAT31(local_158[0]._1_3_,
                            local_60 ==
                            local_148.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    local_150.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (local_188.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.message_.ptr_);
  }
  if ((string)(undefined1)local_158[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(char *)local_158,"(v1 == vpc->variable1()) || (v3 == vpc->variable1())",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x9e,(char *)local_188._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
      operator_delete((void *)local_188._0_8_,local_178[0] + 1);
    }
    if (((local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) && (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0)) {
      (**(code **)(*(long *)local_148.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::VariablePair::variable2();
  if (local_50.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)local_188._0_8_) {
    local_158[0] = CONCAT31(local_158[0]._1_3_,1);
    local_150.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    libcellml::VariablePair::variable2();
    local_158[0] = CONCAT31(local_158[0]._1_3_,
                            local_70 ==
                            local_148.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    local_150.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (local_188.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188.message_.ptr_);
  }
  if ((string)(undefined1)local_158[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(char *)local_158,"(v2 == vpc->variable2()) || (v4 == vpc->variable2())",
               "false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x9f,(char *)local_188._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
      operator_delete((void *)local_188._0_8_,local_178[0] + 1);
    }
    if (((local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) && (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0)) {
      (**(code **)(*(long *)local_148.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8 = CONCAT44(local_f8._4_4_,1);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"component_ref1_id","");
  libcellml::Annotator::item((string *)&local_148);
  local_c4 = libcellml::AnyCellmlElement::type();
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)local_158,"libcellml::CellmlElementType::COMPONENT_REF",
             "annotator->item(\"component_ref1_id\")->type()",(CellmlElementType *)&local_f8,
             &local_c4);
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if ((string)(undefined1)local_158[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xa2,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"component_ref1_id","");
  libcellml::Annotator::item((string *)&local_f8);
  libcellml::AnyCellmlElement::component();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
            ((internal *)local_158,"c1","annotator->item(\"component_ref1_id\")->component()",
             &local_c0,&local_148);
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if ((string)(undefined1)local_158[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xa3,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8 = CONCAT44(local_f8._4_4_,3);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"encapsulation_id","");
  libcellml::Annotator::item((string *)&local_148);
  local_c4 = libcellml::AnyCellmlElement::type();
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)local_158,"libcellml::CellmlElementType::ENCAPSULATION",
             "annotator->item(\"encapsulation_id\")->type()",(CellmlElementType *)&local_f8,
             &local_c4);
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if ((string)(undefined1)local_158[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xa6,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"encapsulation_id","");
  libcellml::Annotator::item((string *)&local_f8);
  libcellml::AnyCellmlElement::model();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((internal *)local_158,"model","annotator->item(\"encapsulation_id\")->model()",
             &local_a0,(shared_ptr<libcellml::Model> *)&local_148);
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if ((string)(undefined1)local_158[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xa7,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8 = CONCAT44(local_f8._4_4_,9);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"reset_value_id","");
  libcellml::Annotator::item((string *)&local_148);
  local_c4 = libcellml::AnyCellmlElement::type();
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)local_158,"libcellml::CellmlElementType::RESET_VALUE",
             "annotator->item(\"reset_value_id\")->type()",(CellmlElementType *)&local_f8,&local_c4)
  ;
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if ((string)(undefined1)local_158[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xaa,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"reset_value_id","");
  libcellml::Annotator::item((string *)&local_f8);
  libcellml::AnyCellmlElement::reset();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
            ((internal *)local_158,"reset","annotator->item(\"reset_value_id\")->reset()",&local_118
             ,(shared_ptr<libcellml::Reset> *)&local_148);
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if ((string)(undefined1)local_158[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xab,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8 = CONCAT44(local_f8._4_4_,10);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"test_value_id","");
  libcellml::Annotator::item((string *)&local_148);
  local_c4 = libcellml::AnyCellmlElement::type();
  testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
            ((internal *)local_158,"libcellml::CellmlElementType::TEST_VALUE",
             "annotator->item(\"test_value_id\")->type()",(CellmlElementType *)&local_f8,&local_c4);
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if ((string)(undefined1)local_158[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xac,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188._0_8_ = (element_type *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"test_value_id","");
  libcellml::Annotator::item((string *)&local_f8);
  libcellml::AnyCellmlElement::reset();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
            ((internal *)local_158,"reset","annotator->item(\"test_value_id\")->reset()",&local_118,
             (shared_ptr<libcellml::Reset> *)&local_148);
  if (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
    operator_delete((void *)local_188._0_8_,local_178[0] + 1);
  }
  if ((string)(undefined1)local_158[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0xad,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((((element_type *)local_188._0_8_ != (element_type *)0x0) &&
        (cVar6 = testing::internal::IsTrue(true), cVar6 != '\0')) &&
       ((element_type *)local_188._0_8_ != (element_type *)0x0)) {
      (**(code **)(*(long *)local_188._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_130.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130.ptr_);
  }
  if (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_50.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_40.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_c0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
  if (local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

TEST(Annotator, duplicateIdBehaviour)
{
    auto model = libcellml::Model::create("model");
    auto annotator = libcellml::Annotator::create();
    auto component = libcellml::Component::create();
    auto variable = libcellml::Variable::create();

    model->setId("duplicateId");
    component->setId("duplicateId");
    variable->setId("duplicateId");

    component->addVariable(variable);
    model->addComponent(component);

    annotator->setModel(model);

    EXPECT_EQ(libcellml::CellmlElementType::UNDEFINED, annotator->item("duplicateId")->type());
    EXPECT_EQ(size_t(1), annotator->issueCount());

    EXPECT_FALSE(annotator->isUnique("duplicateId"));
    EXPECT_EQ(size_t(3), annotator->itemCount("duplicateId"));
}